

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O2

void sd_offset_update<dense_parameters>
               (dense_parameters *weights,features *fs,uint64_t offset,float update,
               float regularization)

{
  float fVar1;
  float *pfVar2;
  size_t i;
  ulong uVar3;
  
  for (i = 0; pfVar2 = (fs->values)._begin, i < (ulong)((long)(fs->values)._end - (long)pfVar2 >> 2)
      ; i = i + 1) {
    uVar3 = weights->_weight_mask & (fs->indicies)._begin[i];
    fVar1 = weights->_begin[uVar3 + offset];
    weights->_begin[uVar3 + offset] = (pfVar2[i] * update - fVar1 * regularization) + fVar1;
  }
  return;
}

Assistant:

void sd_offset_update(T& weights, features& fs, uint64_t offset, float update, float regularization)
{
  for (size_t i = 0; i < fs.size(); i++)
    (&weights[fs.indicies[i]])[offset] += update * fs.values[i] - regularization * (&weights[fs.indicies[i]])[offset];
}